

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_piece_util.cc
# Opt level: O0

bool EqualsCaseInsensitiveASCII(StringPiece a,StringPiece b)

{
  char cVar1;
  char cVar2;
  ulong local_38;
  size_t i;
  StringPiece b_local;
  StringPiece a_local;
  
  if (a.len_ == b.len_) {
    for (local_38 = 0; local_38 < a.len_; local_38 = local_38 + 1) {
      cVar1 = ToLowerASCII(a.str_[local_38]);
      cVar2 = ToLowerASCII(b.str_[local_38]);
      if (cVar1 != cVar2) {
        return false;
      }
    }
    a_local.len_._7_1_ = true;
  }
  else {
    a_local.len_._7_1_ = false;
  }
  return a_local.len_._7_1_;
}

Assistant:

bool EqualsCaseInsensitiveASCII(StringPiece a, StringPiece b) {
  if (a.len_ != b.len_) {
    return false;
  }

  for (size_t i = 0; i < a.len_; ++i) {
    if (ToLowerASCII(a.str_[i]) != ToLowerASCII(b.str_[i])) {
      return false;
    }
  }

  return true;
}